

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerMSL::func_type_decl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,SPIRType *type)

{
  bool bVar1;
  SPIRType *pSVar2;
  SPIREntryPoint *pSVar3;
  CompilerError *pCVar4;
  char (*in_R8) [12];
  char (*in_stack_ffffffffffffff58) [12];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string entry_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string return_type;
  
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&entry_type,this,type,0);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x26])(&local_a0,this,type);
  ::std::operator+(&return_type,&entry_type,&local_a0);
  ::std::__cxx11::string::~string((string *)&local_a0);
  ::std::__cxx11::string::~string((string *)&entry_type);
  if ((this->super_CompilerGLSL).processing_entry_point == false) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)return_type._M_dataplus._M_p == &return_type.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(return_type.field_2._M_allocated_capacity._1_7_,
                    return_type.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = return_type.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = return_type._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(return_type.field_2._M_allocated_capacity._1_7_,
                    return_type.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = return_type._M_string_length;
    return_type._M_string_length = 0;
    return_type.field_2._M_local_buf[0] = '\0';
    return_type._M_dataplus._M_p = (pointer)&return_type.field_2;
    goto LAB_00317ebe;
  }
  bVar1 = get_is_rasterization_disabled(this);
  if (!bVar1 && (this->stage_out_var_id).id != 0) {
    pSVar2 = get_stage_out_struct_type(this);
    in_R8 = (char (*) [12])(this->super_CompilerGLSL).super_Compiler._vptr_Compiler;
    (**(_func_int **)(in_R8[0xc] + 8))(&local_a0,this,pSVar2,0);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x26])(&local_60,this,type);
    ::std::operator+(&entry_type,&local_a0,&local_60);
    ::std::__cxx11::string::operator=((string *)&return_type,(string *)&entry_type);
    ::std::__cxx11::string::~string((string *)&entry_type);
    ::std::__cxx11::string::~string((string *)&local_60);
    ::std::__cxx11::string::~string((string *)&local_a0);
  }
  entry_type._M_dataplus._M_p = (pointer)&entry_type.field_2;
  entry_type._M_string_length = 0;
  entry_type.field_2._M_local_buf[0] = '\0';
  pSVar3 = Compiler::get_entry_point((Compiler *)this);
  switch(pSVar3->model) {
  case ExecutionModelVertex:
    if (((this->msl_options).vertex_for_tessellation == true) &&
       ((this->msl_options).msl_version < 0x27d8)) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10,"kernel");
      ::std::__cxx11::string::string
                ((string *)&local_a0,"Tessellation requires Metal 1.2.",(allocator *)&local_60);
      CompilerError::CompilerError(pCVar4,&local_a0);
      __cxa_throw(pCVar4,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    break;
  case ExecutionModelTessellationControl:
    if ((this->msl_options).msl_version < 0x27d8) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10,"kernel");
      ::std::__cxx11::string::string
                ((string *)&local_a0,"Tessellation requires Metal 1.2.",(allocator *)&local_60);
      CompilerError::CompilerError(pCVar4,&local_a0);
      __cxa_throw(pCVar4,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (((pSVar3->flags).lower & 0x2000000) != 0) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10,"kernel");
      ::std::__cxx11::string::string
                ((string *)&local_a0,"Metal does not support isoline tessellation.",
                 (allocator *)&local_60);
      CompilerError::CompilerError(pCVar4,&local_a0);
      __cxa_throw(pCVar4,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    break;
  case ExecutionModelTessellationEvaluation:
    if ((this->msl_options).msl_version < 0x27d8) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10,"kernel");
      ::std::__cxx11::string::string
                ((string *)&local_a0,"Tessellation requires Metal 1.2.",(allocator *)&local_60);
      CompilerError::CompilerError(pCVar4,&local_a0);
      __cxa_throw(pCVar4,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (((pSVar3->flags).lower & 0x2000000) != 0) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10,"kernel");
      ::std::__cxx11::string::string
                ((string *)&local_a0,"Metal does not support isoline tessellation.",
                 (allocator *)&local_60);
      CompilerError::CompilerError(pCVar4,&local_a0);
      __cxa_throw(pCVar4,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    if ((this->msl_options).platform == iOS) {
      bVar1 = Compiler::is_tessellating_triangles((Compiler *)this);
      local_60._M_dataplus._M_p = "quad";
      if (bVar1) {
        local_60._M_dataplus._M_p = "triangle";
      }
      join<char_const(&)[10],char_const*,char_const(&)[12]>
                (&local_a0,(spirv_cross *)"[[ patch(",(char (*) [10])&local_60,
                 (char **)") ]] vertex",in_R8);
    }
    else {
      bVar1 = Compiler::is_tessellating_triangles((Compiler *)this);
      local_60._M_dataplus._M_p = "quad";
      if (bVar1) {
        local_60._M_dataplus._M_p = "triangle";
      }
      join<char_const(&)[10],char_const*,char_const(&)[3],unsigned_int&,char_const(&)[12]>
                (&local_a0,(spirv_cross *)"[[ patch(",(char (*) [10])&local_60,(char **)0x3b2a97,
                 (char (*) [3])&pSVar3->output_vertices,(uint *)") ]] vertex",
                 in_stack_ffffffffffffff58);
    }
    ::std::__cxx11::string::operator=((string *)&entry_type,(string *)&local_a0);
    ::std::__cxx11::string::~string((string *)&local_a0);
    goto LAB_00317e82;
  default:
    break;
  case ExecutionModelFragment:
    uses_explicit_early_fragment_test(this);
    break;
  case ExecutionModelGLCompute:
  case ExecutionModelKernel:
    break;
  }
  ::std::__cxx11::string::assign((char *)&entry_type);
LAB_00317e82:
  ::std::operator+(&local_a0,&entry_type," ");
  ::std::operator+(__return_storage_ptr__,&local_a0,&return_type);
  ::std::__cxx11::string::~string((string *)&local_a0);
  ::std::__cxx11::string::~string((string *)&entry_type);
LAB_00317ebe:
  ::std::__cxx11::string::~string((string *)&return_type);
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::func_type_decl(SPIRType &type)
{
	// The regular function return type. If not processing the entry point function, that's all we need
	string return_type = type_to_glsl(type) + type_to_array_glsl(type);
	if (!processing_entry_point)
		return return_type;

	// If an outgoing interface block has been defined, and it should be returned, override the entry point return type
	bool ep_should_return_output = !get_is_rasterization_disabled();
	if (stage_out_var_id && ep_should_return_output)
		return_type = type_to_glsl(get_stage_out_struct_type()) + type_to_array_glsl(type);

	// Prepend a entry type, based on the execution model
	string entry_type;
	auto &execution = get_entry_point();
	switch (execution.model)
	{
	case ExecutionModelVertex:
		if (msl_options.vertex_for_tessellation && !msl_options.supports_msl_version(1, 2))
			SPIRV_CROSS_THROW("Tessellation requires Metal 1.2.");
		entry_type = msl_options.vertex_for_tessellation ? "kernel" : "vertex";
		break;
	case ExecutionModelTessellationEvaluation:
		if (!msl_options.supports_msl_version(1, 2))
			SPIRV_CROSS_THROW("Tessellation requires Metal 1.2.");
		if (execution.flags.get(ExecutionModeIsolines))
			SPIRV_CROSS_THROW("Metal does not support isoline tessellation.");
		if (msl_options.is_ios())
			entry_type = join("[[ patch(", is_tessellating_triangles() ? "triangle" : "quad", ") ]] vertex");
		else
			entry_type = join("[[ patch(", is_tessellating_triangles() ? "triangle" : "quad", ", ",
			                  execution.output_vertices, ") ]] vertex");
		break;
	case ExecutionModelFragment:
		entry_type = uses_explicit_early_fragment_test() ? "[[ early_fragment_tests ]] fragment" : "fragment";
		break;
	case ExecutionModelTessellationControl:
		if (!msl_options.supports_msl_version(1, 2))
			SPIRV_CROSS_THROW("Tessellation requires Metal 1.2.");
		if (execution.flags.get(ExecutionModeIsolines))
			SPIRV_CROSS_THROW("Metal does not support isoline tessellation.");
		/* fallthrough */
	case ExecutionModelGLCompute:
	case ExecutionModelKernel:
		entry_type = "kernel";
		break;
	default:
		entry_type = "unknown";
		break;
	}

	return entry_type + " " + return_type;
}